

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void destroy_free<boosting>(void *temp)

{
  void *in_RDI;
  
  boosting::~boosting((boosting *)temp);
  free(in_RDI);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}